

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

size_t __thiscall
kj::ArrayInputStream::tryRead(ArrayInputStream *this,ArrayPtr<unsigned_char> dst,size_t minBytes)

{
  size_t *psVar1;
  ulong __n;
  
  __n = (this->array).size_;
  if (dst.size_ < __n) {
    __n = dst.size_;
  }
  memcpy(dst.ptr,(this->array).ptr,__n);
  (this->array).ptr = (this->array).ptr + __n;
  psVar1 = &(this->array).size_;
  *psVar1 = *psVar1 - __n;
  return __n;
}

Assistant:

size_t ArrayInputStream::tryRead(ArrayPtr<byte> dst, size_t minBytes) {
  size_t n = kj::min(dst.size(), array.size());
  memcpy(dst.begin(), array.begin(), n);
  array = array.slice(n);
  return n;
}